

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_dot(runtime_type *this,var *a,token_base *b)

{
  types tVar1;
  char *pcVar2;
  int iVar3;
  undefined *puVar4;
  constant_values *pcVar5;
  shared_ptr<cs::name_space> *psVar6;
  type_t *this_00;
  proxy *ppVar7;
  namespace_t *pnVar8;
  var *pvVar9;
  undefined4 extraout_var;
  structure *this_01;
  undefined4 extraout_var_00;
  callable *pcVar10;
  runtime_error *prVar11;
  long in_RCX;
  initializer_list<cs_impl::any> __l;
  vector args;
  undefined1 local_90 [32];
  allocator_type local_70 [32];
  any local_50 [4];
  
  if (b->_vptr_token_base == (_func_int **)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    puVar4 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
  }
  pcVar2 = *(char **)(puVar4 + 8);
  if ((pcVar2 == "N2cs15constant_valuesE") ||
     ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,"N2cs15constant_valuesE"), iVar3 == 0)))) {
    pcVar5 = cs_impl::any::const_val<cs::constant_values>((any *)b);
    if (*pcVar5 == local_namepace) {
      pvVar9 = domain_manager::get_var_current<cs::var_id_const&>
                         ((domain_manager *)(a + 6),(var_id *)(in_RCX + 0x10));
    }
    else {
      if (*pcVar5 != global_namespace) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_90._0_8_ = local_90 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Unknown scope tag.","");
        runtime_error::runtime_error(prVar11,(string *)local_90);
        __cxa_throw(prVar11,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      pvVar9 = domain_manager::get_var_global<cs::var_id_const&>
                         ((domain_manager *)(a + 6),(var_id *)(in_RCX + 0x10));
    }
  }
  else {
    if (b->_vptr_token_base == (_func_int **)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      puVar4 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
    }
    pcVar2 = *(char **)(puVar4 + 8);
    if ((pcVar2 == "St10shared_ptrIN2cs10name_spaceEE") ||
       ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,"St10shared_ptrIN2cs10name_spaceEE"), iVar3 == 0))
       )) {
      psVar6 = cs_impl::any::val<std::shared_ptr<cs::name_space>>((any *)b);
      pvVar9 = domain_type::get_var
                         (((psVar6->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_data,(var_id *)(in_RCX + 0x10));
    }
    else {
      if (b->_vptr_token_base == (_func_int **)0x0) {
        puVar4 = &void::typeinfo;
      }
      else {
        puVar4 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
      }
      pcVar2 = *(char **)(puVar4 + 8);
      if ((pcVar2 != "N2cs6type_tE") &&
         ((*pcVar2 == '*' || (iVar3 = strcmp(pcVar2,"N2cs6type_tE"), iVar3 != 0)))) {
        if (b->_vptr_token_base == (_func_int **)0x0) {
          puVar4 = &void::typeinfo;
        }
        else {
          puVar4 = (undefined *)(**(code **)(*(long *)b->_vptr_token_base[2] + 0x10))();
        }
        pcVar2 = *(char **)(puVar4 + 8);
        if ((pcVar2 == "N2cs9structureE") ||
           ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,"N2cs9structureE"), iVar3 == 0)))) {
          this_01 = cs_impl::any::val<cs::structure>((any *)b);
          pvVar9 = structure::get_var<cs::var_id_const&>(this_01,(var_id *)(in_RCX + 0x10));
          if (pvVar9->mDat == (proxy *)0x0) {
            puVar4 = &void::typeinfo;
          }
          else {
            iVar3 = (*pvVar9->mDat->data->_vptr_baseHolder[2])();
            puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar3);
          }
          pcVar2 = *(char **)(puVar4 + 8);
          if (((pcVar2 == "N2cs8callableE") ||
              ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,"N2cs8callableE"), iVar3 == 0)))) &&
             (pcVar10 = cs_impl::any::const_val<cs::callable>(pvVar9), pcVar10->mType == member_fn))
          {
            cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&>
                      ((any *)this,(any *)b,pvVar9);
            return (var)(proxy *)this;
          }
          ppVar7 = pvVar9->mDat;
        }
        else {
          pnVar8 = cs_impl::any::get_ext((any *)b);
          pvVar9 = domain_type::get_var
                             (((pnVar8->
                               super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->m_data,(var_id *)(in_RCX + 0x10));
          if (pvVar9->mDat == (proxy *)0x0) {
            puVar4 = &void::typeinfo;
          }
          else {
            iVar3 = (*pvVar9->mDat->data->_vptr_baseHolder[2])();
            puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
          }
          pcVar2 = *(char **)(puVar4 + 8);
          if ((pcVar2 == "N2cs8callableE") ||
             ((*pcVar2 != '*' && (iVar3 = strcmp(pcVar2,"N2cs8callableE"), iVar3 == 0)))) {
            pcVar10 = cs_impl::any::const_val<cs::callable>(pvVar9);
            tVar1 = pcVar10->mType;
            if (tVar1 != member_visitor) {
              if (tVar1 != force_regular) {
                local_90[0] = tVar1 == request_fold;
                cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&,bool>
                          ((any *)this,(any *)b,pvVar9,(bool *)local_90);
                return (var)(proxy *)this;
              }
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x28);
              local_90._0_8_ = local_90 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_90,"Cannot call regular function as member function.","");
              runtime_error::runtime_error(prVar11,(string *)local_90);
              __cxa_throw(prVar11,&runtime_error::typeinfo,runtime_error::~runtime_error);
            }
            local_50[0].mDat = (proxy *)b->_vptr_token_base;
            if (local_50[0].mDat != (proxy *)0x0) {
              (local_50[0].mDat)->refcount = (local_50[0].mDat)->refcount + 1;
            }
            __l._M_len = 1;
            __l._M_array = local_50;
            std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                      ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_90,__l,local_70)
            ;
            cs_impl::any::recycle(local_50);
            if ((pcVar10->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
              (*(pcVar10->mFunc)._M_invoker)
                        ((_Any_data *)this,
                         (vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)pcVar10);
              std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                        ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_90);
              return (var)(proxy *)this;
            }
            std::__throw_bad_function_call();
          }
          ppVar7 = pvVar9->mDat;
        }
        goto LAB_0025c7f9;
      }
      this_00 = cs_impl::any::const_val<cs::type_t>((any *)b);
      pvVar9 = type_t::get_var<cs::var_id_const&>(this_00,(var_id *)(in_RCX + 0x10));
    }
  }
  ppVar7 = pvVar9->mDat;
LAB_0025c7f9:
  if (ppVar7 != (proxy *)0x0) {
    ppVar7->refcount = ppVar7->refcount + 1;
  }
  (this->literals).
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = &ppVar7->is_rvalue;
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_dot(const var &a, token_base *b)
	{
		if (a.type() == typeid(constant_values)) {
			switch (a.const_val<constant_values>()) {
			case constant_values::global_namespace:
				return storage.get_var_global(static_cast<token_id *>(b)->get_id());
			case constant_values::local_namepace:
				return storage.get_var_current(static_cast<token_id *>(b)->get_id());
			default:
				throw runtime_error("Unknown scope tag.");
			}
		}
		else if (a.type() == typeid(namespace_t))
			return a.val<namespace_t>()->get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(type_t))
			return a.const_val<type_t>().get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(structure)) {
			var &val = a.val<structure>().get_var(static_cast<token_id *>(b)->get_id());
			if (val.type() == typeid(callable) && val.const_val<callable>().is_member_fn())
				return var::make_protect<object_method>(a, val);
			else
				return val;
		}
		else {
			try {
				var &val = a.get_ext()->get_var(static_cast<token_id *>(b)->get_id());
				if (val.type() == typeid(callable)) {
					const callable &func = val.const_val<callable>();
					switch (func.type()) {
					case callable::types::member_visitor: {
						vector args{a};
						return func.call(args);
					}
					case callable::types::force_regular:
						throw runtime_error("Cannot call regular function as member function.");
					default:
						return var::make_protect<object_method>(a, val, func.is_request_fold());
					}
				}
				else
					return val;
			}
			catch (...) {
				if (a.type() == typeid(hash_map)) {
					const auto &cmap = a.const_val<hash_map>();
					const string &str = static_cast<token_id *>(b)->get_id().get_id();
					if (cmap.count(str) == 0)
						throw runtime_error(std::string("Key \"") + str + "\" does not exist.");
					return cmap.at(str);
				}
				else
					throw;
			}
		}
	}